

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

ModsqrtContext * modsqrt_new(mp_int *p,mp_int *any_nonsquare_mod_p)

{
  uint uVar1;
  ModsqrtContext *__s;
  mp_int *pmVar2;
  MontyContext *pMVar3;
  ModsqrtContext *sc;
  mp_int *any_nonsquare_mod_p_local;
  mp_int *p_local;
  
  __s = (ModsqrtContext *)safemalloc(1,0x38,0);
  memset(__s,0,0x38);
  pmVar2 = mp_copy(p);
  __s->p = pmVar2;
  pMVar3 = monty_new(__s->p);
  __s->mc = pMVar3;
  pmVar2 = monty_import(__s->mc,any_nonsquare_mod_p);
  __s->z = pmVar2;
  __s->e = 1;
  while ((__s->e < p->nw << 6 && (uVar1 = mp_get_bit(p,__s->e), uVar1 == 0))) {
    __s->e = __s->e + 1;
  }
  pmVar2 = mp_rshift_fixed(p,__s->e);
  __s->k = pmVar2;
  pmVar2 = mp_rshift_fixed(__s->k,1);
  __s->km1o2 = pmVar2;
  return __s;
}

Assistant:

ModsqrtContext *modsqrt_new(mp_int *p, mp_int *any_nonsquare_mod_p)
{
    ModsqrtContext *sc = snew(ModsqrtContext);
    memset(sc, 0, sizeof(ModsqrtContext));

    sc->p = mp_copy(p);
    sc->mc = monty_new(sc->p);
    sc->z = monty_import(sc->mc, any_nonsquare_mod_p);

    /* Find the lowest set bit in p-1. Since this routine expects p to
     * be non-secret (typically a well-known standard elliptic curve
     * parameter), for once we don't need clever bit tricks. */
    for (sc->e = 1; sc->e < BIGNUM_INT_BITS * p->nw; sc->e++)
        if (mp_get_bit(p, sc->e))
            break;

    sc->k = mp_rshift_fixed(p, sc->e);
    sc->km1o2 = mp_rshift_fixed(sc->k, 1);

    /* Leave zk to be filled in lazily, since it's more expensive to
     * compute. If this context turns out never to be needed, we can
     * save the bulk of the setup time this way. */

    return sc;
}